

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsoncbor.cpp
# Opt level: O2

QString * makeString(QString *__return_storage_ptr__,QCborContainerPrivate *d,qsizetype idx,
                    ConversionMode mode)

{
  Type t;
  QCborContainerPrivate *d_00;
  qsizetype qVar1;
  Data *pDVar2;
  Int IVar3;
  char16_t *pcVar4;
  Element *pEVar5;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  pEVar5 = (d->elements).d.ptr;
  t = pEVar5[idx].type;
  switch(t) {
  case False:
    local_38.d = (Data *)0x0;
    (__return_storage_ptr__->d).d = (Data *)0x0;
    local_38.ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).ptr = L"false";
    local_38.size = 0;
    (__return_storage_ptr__->d).size = 5;
    break;
  case True:
    (__return_storage_ptr__->d).d = (Data *)0x0;
    pcVar4 = L"true";
    goto LAB_002bfeaa;
  case Null:
    (__return_storage_ptr__->d).d = (Data *)0x0;
    pcVar4 = L"null";
LAB_002bfeaa:
    local_38.ptr = (char16_t *)0x0;
    local_38.d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = pcVar4;
    local_38.size = 0;
    (__return_storage_ptr__->d).size = 4;
    break;
  case Undefined:
    local_38.d = (Data *)0x0;
    (__return_storage_ptr__->d).d = (Data *)0x0;
    local_38.ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).ptr = L"undefined";
    local_38.size = 0;
    (__return_storage_ptr__->d).size = 9;
    break;
  default:
    pEVar5 = pEVar5 + idx;
    if ((0x25 < (uint)(t + 0xffff0000)) ||
       ((0x2900000001U >> ((ulong)(uint)(t + 0xffff0000) & 0x3f) & 1) == 0)) {
      if (t == Invalid) {
        if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
          (__return_storage_ptr__->d).d = (Data *)0x0;
          (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
          (__return_storage_ptr__->d).size = 0;
          return __return_storage_ptr__;
        }
        goto LAB_002bffa4;
      }
      if (t == Double) {
        if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
          QString::number(__return_storage_ptr__,(double)pEVar5->field_0,'g',6);
          return __return_storage_ptr__;
        }
        goto LAB_002bffa4;
      }
      if (t == ByteArray) {
        if (mode != FromVariantToJson) {
          if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
            encodeByteArray(__return_storage_ptr__,d,idx,0x15);
            return __return_storage_ptr__;
          }
          goto LAB_002bffa4;
        }
      }
      else if (t != String) {
        if ((t != Array) && (t != Map)) {
          if (t != Tag) {
            if (t == Integer) {
              if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
                QString::number(__return_storage_ptr__,(pEVar5->field_0).value,10);
                return __return_storage_ptr__;
              }
            }
            else if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
              simpleTypeString(__return_storage_ptr__,t);
              return __return_storage_ptr__;
            }
            goto LAB_002bffa4;
          }
          goto LAB_002bfd30;
        }
        QCborContainerPrivate::valueAt((QCborValue *)&local_38,d,idx);
        QCborValue::toDiagnosticNotation
                  (__return_storage_ptr__,(QCborValue *)&local_38,(DiagnosticNotationOptions)0x0);
        QCborValue::~QCborValue((QCborValue *)&local_38);
        goto LAB_002bfec0;
      }
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        QCborContainerPrivate::stringAt(__return_storage_ptr__,d,idx);
        return __return_storage_ptr__;
      }
      goto LAB_002bffa4;
    }
LAB_002bfd30:
    IVar3 = (pEVar5->flags).super_QFlagsStorageHelper<QtCbor::Element::ValueFlag,_4>.
            super_QFlagsStorage<QtCbor::Element::ValueFlag>.i;
    d_00 = (pEVar5->field_0).container;
    (__return_storage_ptr__->d).size = 0;
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    if ((d_00 != (QCborContainerPrivate *)0x0 && (IVar3 & 1) != 0) && ((d_00->elements).d.size == 2)
       ) {
      maybeEncodeTag((QString *)&local_38,d_00);
      pDVar2 = (__return_storage_ptr__->d).d;
      pcVar4 = (__return_storage_ptr__->d).ptr;
      (__return_storage_ptr__->d).d = local_38.d;
      (__return_storage_ptr__->d).ptr = local_38.ptr;
      qVar1 = (__return_storage_ptr__->d).size;
      (__return_storage_ptr__->d).size = local_38.size;
      local_38.d = pDVar2;
      local_38.ptr = pcVar4;
      local_38.size = qVar1;
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_38);
      if ((__return_storage_ptr__->d).ptr == (char16_t *)0x0) {
        makeString((QString *)&local_38,d_00,1,FromRaw);
        pDVar2 = (__return_storage_ptr__->d).d;
        pcVar4 = (__return_storage_ptr__->d).ptr;
        (__return_storage_ptr__->d).d = local_38.d;
        (__return_storage_ptr__->d).ptr = local_38.ptr;
        qVar1 = (__return_storage_ptr__->d).size;
        (__return_storage_ptr__->d).size = local_38.size;
        local_38.d = pDVar2;
        local_38.ptr = pcVar4;
        local_38.size = qVar1;
        break;
      }
    }
    goto LAB_002bfec0;
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_38);
LAB_002bfec0:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return __return_storage_ptr__;
  }
LAB_002bffa4:
  __stack_chk_fail();
}

Assistant:

Q_NEVER_INLINE static QString makeString(const QCborContainerPrivate *d, qsizetype idx,
                                         ConversionMode mode)
{
    const auto &e = d->elements.at(idx);

    switch (e.type) {
    case QCborValue::Integer:
        return QString::number(qint64(e.value));

    case QCborValue::Double:
        return QString::number(e.fpvalue());

    case QCborValue::ByteArray:
        return mode == ConversionMode::FromVariantToJson
                ? d->stringAt(idx)
                : encodeByteArray(d, idx, QCborTag(QCborKnownTags::ExpectedBase64url));

    case QCborValue::String:
        return d->stringAt(idx);

    case QCborValue::Array:
    case QCborValue::Map:
#if defined(QT_BOOTSTRAPPED)
        Q_UNREACHABLE_RETURN(QString());
#else
        return d->valueAt(idx).toDiagnosticNotation(QCborValue::Compact);
#endif

    case QCborValue::SimpleType:
        break;

    case QCborValue::False:
        return QStringLiteral("false");

    case QCborValue::True:
        return QStringLiteral("true");

    case QCborValue::Null:
        return QStringLiteral("null");

    case QCborValue::Undefined:
        return QStringLiteral("undefined");

    case QCborValue::Invalid:
        return QString();

    case QCborValue::Tag:
    case QCborValue::DateTime:
    case QCborValue::Url:
    case QCborValue::RegularExpression:
    case QCborValue::Uuid:
        return encodeTag(e.flags & Element::IsContainer ? e.container : nullptr);
    }

    // maybe it's a simple type
    return simpleTypeString(e.type);
}